

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

void tok_add_define(tokcxdef *ctx,char *sym,int len,char *expan,int explen)

{
  int iVar1;
  tokdfdef *ptVar2;
  uchar *puVar3;
  errcxdef *in_RCX;
  int in_EDX;
  char *in_RSI;
  long in_RDI;
  int in_R8D;
  tokdfdef *df;
  int hsh;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  
  ptVar2 = tok_find_define((tokcxdef *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),(char *)in_RCX,
                           in_R8D);
  if (ptVar2 == (tokdfdef *)0x0) {
    iVar1 = tokdfhsh(in_RSI,in_EDX);
    puVar3 = mchalo(in_RCX,CONCAT44(in_R8D,iVar1),in_stack_ffffffffffffffd0);
    *(uchar **)(puVar3 + 8) = puVar3 + (long)in_R8D + 0x18;
    *(int *)(puVar3 + 0x10) = in_EDX;
    *(int *)(puVar3 + 0x14) = in_R8D;
    memcpy(puVar3 + 0x18,in_RCX,(long)in_R8D);
    memcpy(*(void **)(puVar3 + 8),in_RSI,(long)in_EDX);
    *(undefined8 *)puVar3 = *(undefined8 *)(in_RDI + 0x2b0 + (long)iVar1 * 8);
    *(uchar **)(in_RDI + 0x2b0 + (long)iVar1 * 8) = puVar3;
  }
  return;
}

Assistant:

void tok_add_define(tokcxdef *ctx, char *sym, int len,
                    char *expan, int explen)
{
    int       hsh;
    tokdfdef *df;

    /* if it's already defined, ignore it */
    if (tok_find_define(ctx, sym, len))
        return;

    /* find the appropriate entry in the hash table */
    hsh = tokdfhsh(sym, len);

    /* allocate space for the symbol */
    df = (tokdfdef *)mchalo(ctx->tokcxerr,
                            (sizeof(tokdfdef) + len + explen - 1),
                            "tok_add_define");

    /* set up the new symbol */
    df->nm = df->expan + explen;
    df->len = len;
    df->explen = explen;
    memcpy(df->expan, expan, explen);
    memcpy(df->nm, sym, len);

    /* link it into the hash chain */
    df->nxt = ctx->tokcxdf[hsh];
    ctx->tokcxdf[hsh] = df;
}